

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O1

int isscalar(Context *ctx,MOJOSHADER_shaderType shader_type,RegisterType rtype,int rnum)

{
  int *piVar1;
  int *piVar2;
  bool bVar3;
  uint uVar4;
  Context *pCVar5;
  bool bVar6;
  
  bVar6 = true;
  switch(rtype) {
  case REG_TYPE_RASTOUT:
switchD_00120950_caseD_4:
    bVar6 = rnum - 1U < 2;
    break;
  case REG_TYPE_OUTPUT:
    piVar1 = &ctx->uses_pointsize;
    piVar2 = &ctx->uses_fog;
    if (*piVar1 != 0 || *piVar2 != 0) {
      pCVar5 = (Context *)(ctx->attributes).next;
      do {
        if (pCVar5 == (Context *)0x0) {
          ctx = (Context *)0x0;
          break;
        }
        uVar4 = pCVar5->isfail << 0x10 | pCVar5->out_of_memory;
        if ((rnum | 0x60000U) == uVar4) {
          bVar3 = false;
          ctx = pCVar5;
        }
        else if ((rnum | 0x60000U) < uVar4) {
          ctx = (Context *)0x0;
          bVar3 = false;
        }
        else {
          pCVar5 = (Context *)pCVar5->orig_tokens;
          bVar3 = true;
        }
      } while (bVar3);
      if (ctx != (Context *)0x0) {
        bVar6 = *(int *)&ctx->malloc == 0xb && *piVar2 != 0 ||
                *(int *)&ctx->malloc == 4 && *piVar1 != 0;
        goto LAB_00120a24;
      }
    }
    switch(rtype) {
    case REG_TYPE_DEPTHOUT:
    case REG_TYPE_CONSTBOOL:
    case REG_TYPE_LOOP:
      goto switchD_00120950_caseD_9;
    case REG_TYPE_SAMPLER:
    case REG_TYPE_CONST2:
    case REG_TYPE_CONST3:
    case REG_TYPE_CONST4:
    case REG_TYPE_TEMPFLOAT16:
    case REG_TYPE_LABEL:
      break;
    case REG_TYPE_MISCTYPE:
      goto switchD_00120950_caseD_11;
    case REG_TYPE_MAX:
      goto switchD_00120950_caseD_13;
    default:
      if (rtype == REG_TYPE_RASTOUT) goto switchD_00120950_caseD_4;
    }
  default:
    bVar6 = false;
    break;
  case REG_TYPE_DEPTHOUT:
  case REG_TYPE_CONSTBOOL:
  case REG_TYPE_LOOP:
    break;
  case REG_TYPE_MISCTYPE:
switchD_00120950_caseD_11:
    bVar6 = rnum == 1;
    break;
  case REG_TYPE_MAX:
switchD_00120950_caseD_13:
    bVar6 = shader_type == MOJOSHADER_TYPE_PIXEL;
  }
switchD_00120950_caseD_9:
LAB_00120a24:
  return (uint)bVar6;
}

Assistant:

static int isscalar(Context *ctx, const MOJOSHADER_shaderType shader_type,
                    const RegisterType rtype, const int rnum)
{
    const int uses_psize = ctx->uses_pointsize;
    const int uses_fog = ctx->uses_fog;
    if ( (rtype == REG_TYPE_OUTPUT) && ((uses_psize) || (uses_fog)) )
    {
        const RegisterList *reg = reglist_find(&ctx->attributes, rtype, rnum);
        if (reg != NULL)
        {
            const MOJOSHADER_usage usage = reg->usage;
            return ( (uses_psize && (usage == MOJOSHADER_USAGE_POINTSIZE)) ||
                     (uses_fog && (usage == MOJOSHADER_USAGE_FOG)) );
        } // if
    } // if

    return scalar_register(shader_type, rtype, rnum);
}